

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::InsertRangeAfter(Instr *this,Instr *startInstr,Instr *endInstr)

{
  Instr *pIVar1;
  Instr *nextInstr;
  Instr *endInstr_local;
  Instr *startInstr_local;
  Instr *this_local;
  
  pIVar1 = this->m_next;
  endInstr->m_next = pIVar1;
  this->m_next = startInstr;
  if (pIVar1 != (Instr *)0x0) {
    pIVar1->m_prev = endInstr;
  }
  startInstr->m_prev = this;
  return;
}

Assistant:

void
Instr::InsertRangeAfter(Instr *startInstr, Instr *endInstr)
{
    Instr * nextInstr = this->m_next;

    endInstr->m_next = nextInstr;
    this->m_next = startInstr;

    if (nextInstr)
    {
        nextInstr->m_prev = endInstr;
    }
    startInstr->m_prev = this;
}